

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PduSuperclass.cpp
# Opt level: O2

void __thiscall DIS::PduSuperclass::unmarshal(PduSuperclass *this,DataStream *dataStream)

{
  DataStream::operator>>(dataStream,&this->_protocolVersion);
  DataStream::operator>>(dataStream,&this->_exerciseID);
  DataStream::operator>>(dataStream,&this->_pduType);
  DataStream::operator>>(dataStream,&this->_protocolFamily);
  DataStream::operator>>(dataStream,&this->_timestamp);
  DataStream::operator>>(dataStream,&this->_length);
  return;
}

Assistant:

void PduSuperclass::unmarshal(DataStream& dataStream)
{
    dataStream >> _protocolVersion;
    dataStream >> _exerciseID;
    dataStream >> _pduType;
    dataStream >> _protocolFamily;
    dataStream >> _timestamp;
    dataStream >> _length;
}